

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O2

wchar_t hist_init(EditLine *el)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  
  pwVar2 = (wchar_t *)calloc(0x400,4);
  (el->el_history).ref = (void *)0x0;
  (el->el_history).fun = (hist_fun_t)0x0;
  (el->el_history).buf = pwVar2;
  if (pwVar2 == (wchar_t *)0x0) {
    wVar1 = L'\xffffffff';
  }
  else {
    (el->el_history).sz = 0x400;
    (el->el_history).last = pwVar2;
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

libedit_private int
hist_init(EditLine *el)
{

	el->el_history.fun = NULL;
	el->el_history.ref = NULL;
	el->el_history.buf = el_calloc(EL_BUFSIZ, sizeof(*el->el_history.buf));
	if (el->el_history.buf == NULL)
		return -1;
	el->el_history.sz  = EL_BUFSIZ;
	el->el_history.last = el->el_history.buf;
	return 0;
}